

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.hpp
# Opt level: O0

void __thiscall pstore::index::details::index_pointer::index_pointer(index_pointer *this)

{
  index_pointer *this_local;
  
  *(undefined8 *)this = 0;
  return;
}

Assistant:

index_pointer () noexcept
                        : internal_{nullptr} {

                    // A belt-and-braces runtime check for cases where pop_count() can't be
                    // constexpr.
                    assert (hash_index_bits == bit_count::pop_count (hash_size - 1));

                    PSTORE_STATIC_ASSERT (sizeof (index_pointer) == 8);
                    PSTORE_STATIC_ASSERT (alignof (index_pointer) == 8);
                    PSTORE_STATIC_ASSERT (offsetof (index_pointer, addr_) == 0);
                    PSTORE_STATIC_ASSERT (sizeof (internal_) == sizeof (addr_));
                    PSTORE_STATIC_ASSERT (offsetof (index_pointer, internal_) == 0);
                    PSTORE_STATIC_ASSERT (sizeof (linear_) == sizeof (addr_));
                    PSTORE_STATIC_ASSERT (offsetof (index_pointer, linear_) == 0);
                }